

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeEventCreatePrologue
          (ZEParameterValidation *this,ze_event_pool_handle_t hEventPool,ze_event_desc_t *desc,
          ze_event_handle_t *phEvent)

{
  ze_structure_type_t *pzVar1;
  ze_structure_type_t *pzVar2;
  ze_result_t zVar3;
  bool bVar4;
  initializer_list<_ze_structure_type_t> __l;
  vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_> baseTypes;
  allocator_type local_2d;
  _ze_structure_type_t local_2c;
  vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_> local_28;
  
  if (hEventPool == (ze_event_pool_handle_t)0x0) {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (((phEvent != (ze_event_handle_t *)0x0 && desc != (ze_event_desc_t *)0x0) &&
        (zVar3 = ZE_RESULT_ERROR_INVALID_ENUMERATION, desc->signal < 8)) && (desc->wait < 8)) {
      local_2c = ZE_STRUCTURE_TYPE_EVENT_DESC;
      __l._M_len = 1;
      __l._M_array = &local_2c;
      std::vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>::vector
                (&local_28,__l,&local_2d);
      zVar3 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
      if (local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        bVar4 = false;
        pzVar1 = local_28.
                 super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          pzVar2 = pzVar1 + 1;
          if (desc->stype == *pzVar1) {
            bVar4 = true;
            break;
          }
          pzVar1 = pzVar2;
        } while (pzVar2 != local_28.
                           super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if ((bVar4) && (((int *)desc->pNext == (int *)0x0 || (*desc->pNext < 0x100000)))) {
          zVar3 = ZE_RESULT_SUCCESS;
        }
      }
      if (local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
          _M_impl.super__Vector_impl_data._M_start != (ze_structure_type_t *)0x0) {
        operator_delete(local_28.
                        super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeEventCreatePrologue(
        ze_event_pool_handle_t hEventPool,              ///< [in] handle of the event pool
        const ze_event_desc_t* desc,                    ///< [in] pointer to event descriptor
        ze_event_handle_t* phEvent                      ///< [out] pointer to handle of event object created
        )
    {
        if( nullptr == hEventPool )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phEvent )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x7 < desc->signal )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0x7 < desc->wait )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }